

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationSingleQueueTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::synchronization::anon_unknown_2::SemaphoreTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SemaphoreTestInstance *this)

{
  VkPhysicalDevice pVVar1;
  DeviceInterface *vk;
  MultiQueues *this_00;
  long *plVar2;
  OperationContext *context;
  VkDevice *ppVVar3;
  VkCommandPool obj;
  Handle<(vk::HandleType)4> HVar4;
  Handle<(vk::HandleType)4> HVar5;
  VkDevice device;
  VkQueueFlags flagsWrite;
  VkQueueFlags flagsRead;
  uint uVar6;
  uint uVar7;
  VkResult VVar8;
  int iVar9;
  Resource *pRVar10;
  void *__s2;
  pointer pQVar11;
  long lVar12;
  SyncInfo SVar13;
  undefined1 auVar14 [16];
  VkCommandBuffer cmdBuffers [2];
  ulong local_200;
  VkPipelineStageFlags stageBits [1];
  UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
  resource;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  SyncInfo local_1c0;
  SyncInfo local_1b0;
  vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  queuePairs;
  Move<vk::Handle<(vk::HandleType)4>_> local_188;
  undefined8 uStack_168;
  undefined4 local_160;
  VkCommandBuffer *local_158;
  undefined4 local_150;
  VkSemaphore *local_148;
  undefined4 local_140 [2];
  undefined8 local_138;
  undefined4 local_130;
  VkSemaphore *local_128;
  VkPipelineStageFlags *local_120;
  undefined4 local_118;
  VkCommandBuffer *local_110;
  undefined4 local_108;
  undefined8 local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  string *local_f0;
  ResourceDescription *local_e8;
  VkDevice local_e0;
  VkSemaphore local_d8;
  Deleter<vk::Handle<(vk::HandleType)4>_> DStack_d0;
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool [2];
  
  pVVar1 = (this->super_BaseTestInstance).m_opContext.m_physicalDevice;
  vk = *(DeviceInterface **)(pVVar1 + 8);
  local_e0 = *(VkDevice *)(pVVar1 + 0x18);
  this_00 = (MultiQueues *)(this->super_BaseTestInstance).m_opContext.m_vki;
  flagsWrite = (**(code **)(*(long *)(this->super_BaseTestInstance).m_resource.
                                     super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                     .m_data.ptr + 0x18))();
  plVar2 = *(long **)&(this->super_BaseTestInstance).m_resource.
                      super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                      .m_data.field_0x8;
  flagsRead = (**(code **)(*plVar2 + 0x18))
                        (plVar2,(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  MultiQueues::getQueuesPairs(&queuePairs,this_00,flagsWrite,flagsRead);
  pQVar11 = queuePairs.
            super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)queuePairs.
                          super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)queuePairs.
                         super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 != 0) {
    local_e8 = (ResourceDescription *)&(this->super_BaseTestInstance).m_opContext.m_allocator;
    local_f0 = (string *)&__return_storage_ptr__->m_description;
    local_f8 = &(__return_storage_ptr__->m_description).field_2;
    local_200 = 0;
    do {
      pQVar11 = queuePairs.
                super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar10 = (Resource *)operator_new(0x80);
      context = (OperationContext *)(this->super_BaseTestInstance).m_opContext.m_physicalDevice;
      uVar6 = (**(code **)(*(long *)(this->super_BaseTestInstance).m_resource.
                                    super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                    .m_data.ptr + 0x10))();
      uVar7 = (**(code **)(**(long **)&(this->super_BaseTestInstance).m_resource.
                                       super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                       .m_data.field_0x8 + 0x10))();
      local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = 0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      Resource::Resource(pRVar10,context,local_e8,uVar7 | uVar6,VK_SHARING_MODE_EXCLUSIVE,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_188);
      device = local_e0;
      resource.
      super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
      .m_data.ptr = pRVar10;
      if ((long *)local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal
          != (long *)0x0) {
        operator_delete((void *)local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.
                                object.m_internal,
                        (long)local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter
                              .m_device -
                        local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.
                        m_internal);
      }
      pRVar10 = (this->super_BaseTestInstance).m_resource.
                super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                .m_data.ptr;
      (**(code **)(*(long *)pRVar10 + 0x28))
                (&local_188,pRVar10,(this->super_BaseTestInstance).m_opContext.m_physicalDevice,
                 resource.
                 super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 .m_data.ptr);
      HVar4.m_internal =
           local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
      plVar2 = *(long **)&(this->super_BaseTestInstance).m_resource.
                          super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                          .m_data.field_0x8;
      (**(code **)(*plVar2 + 0x28))
                (&local_188,plVar2,(this->super_BaseTestInstance).m_opContext.m_physicalDevice,
                 resource.
                 super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 .m_data.ptr);
      HVar5.m_internal =
           local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
      ::vk::createCommandPool
                (cmdPool,vk,device,2,pQVar11[local_200].familyIndexWrite,
                 (VkAllocationCallbacks *)0x0);
      pQVar11 = pQVar11 + local_200;
      ::vk::createCommandPool
                (cmdPool + 1,vk,device,2,pQVar11->familyIndexRead,(VkAllocationCallbacks *)0x0);
      makeCommandBuffer(ptrCmdBuffer,vk,device,
                        (VkCommandPool)
                        cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                        m_internal);
      makeCommandBuffer(ptrCmdBuffer + 1,vk,device,
                        (VkCommandPool)
                        cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                        m_internal);
      cmdBuffers[0] = ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
      cmdBuffers[1] = ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
      ::vk::createSemaphore(&local_188,vk,device,0,(VkAllocationCallbacks *)0x0);
      DStack_d0.m_device._0_4_ =
           local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device._0_4_;
      DStack_d0.m_device._4_4_ =
           local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device._4_4_;
      DStack_d0.m_allocator._0_4_ =
           local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator._0_4_;
      DStack_d0.m_allocator._4_4_ =
           local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator._4_4_;
      local_d8.m_internal =
           local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
      DStack_d0.m_deviceIface =
           local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface;
      stageBits[0] = 1;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal._0_4_ = 4;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device =
           (VkDevice)
           ((ulong)local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device.
                   _4_4_ << 0x20);
      local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      uStack_168 = 0;
      local_160 = 1;
      local_158 = cmdBuffers;
      local_150 = 1;
      local_148 = &local_d8;
      local_140[0] = 4;
      local_138 = 0;
      local_130 = 1;
      local_120 = stageBits;
      local_118 = 1;
      local_108 = 0;
      local_100 = 0;
      local_128 = local_148;
      local_110 = cmdBuffers + 1;
      SVar13 = (SyncInfo)(**(code **)(*(long *)HVar4.m_internal + 0x18))(HVar4.m_internal);
      local_1b0 = SVar13;
      SVar13 = (SyncInfo)(**(code **)(*(long *)HVar5.m_internal + 0x18))(HVar5.m_internal);
      local_1c0 = SVar13;
      beginCommandBuffer(vk,cmdBuffers[0]);
      (**(code **)(*(long *)HVar4.m_internal + 0x10))(HVar4.m_internal,cmdBuffers[0]);
      createBarrierMultiQueue
                (vk,cmdBuffers,&local_1b0,&local_1c0,
                 resource.
                 super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 .m_data.ptr,pQVar11->familyIndexWrite,pQVar11->familyIndexRead,
                 *(VkSharingMode *)
                  &(this->super_BaseTestInstance).m_writeOp.
                   super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                   .m_data.ptr,false);
      endCommandBuffer(vk,cmdBuffers[0]);
      beginCommandBuffer(vk,cmdBuffers[1]);
      createBarrierMultiQueue
                (vk,cmdBuffers + 1,&local_1b0,&local_1c0,
                 resource.
                 super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 .m_data.ptr,pQVar11->familyIndexWrite,pQVar11->familyIndexRead,
                 *(VkSharingMode *)
                  &(this->super_BaseTestInstance).m_writeOp.
                   super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                   .m_data.ptr,true);
      (**(code **)(*(long *)HVar5.m_internal + 0x10))(HVar5.m_internal,cmdBuffers[1]);
      endCommandBuffer(vk,cmdBuffers[1]);
      VVar8 = (*vk->_vptr_DeviceInterface[2])(vk,pQVar11->queueWrite,1,&local_188);
      ::vk::checkResult(VVar8,
                        "vk.queueSubmit(queuePairs[pairNdx].queueWrite, 1u, &submitInfo[QUEUETYPE_WRITE], DE_NULL)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperationMultiQueueTests.cpp"
                        ,0x177);
      VVar8 = (*vk->_vptr_DeviceInterface[2])(vk,pQVar11->queueRead,1,local_140);
      ::vk::checkResult(VVar8,
                        "vk.queueSubmit(queuePairs[pairNdx].queueRead, 1u, &submitInfo[QUEUETYPE_READ], DE_NULL)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperationMultiQueueTests.cpp"
                        ,0x178);
      VVar8 = (*vk->_vptr_DeviceInterface[3])(vk,pQVar11->queueWrite);
      ::vk::checkResult(VVar8,"vk.queueWaitIdle(queuePairs[pairNdx].queueWrite)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperationMultiQueueTests.cpp"
                        ,0x179);
      VVar8 = (*vk->_vptr_DeviceInterface[3])(vk,pQVar11->queueRead);
      ::vk::checkResult(VVar8,"vk.queueWaitIdle(queuePairs[pairNdx].queueRead)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperationMultiQueueTests.cpp"
                        ,0x17a);
      auVar14 = (**(code **)(*(long *)HVar4.m_internal + 0x20))(HVar4.m_internal);
      (**(code **)(*(long *)HVar5.m_internal + 0x20))(HVar5.m_internal);
      iVar9 = bcmp(auVar14._8_8_,__s2,auVar14._0_8_);
      if (iVar9 != 0) {
        local_1e0 = local_1d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e0,"Memory contents don\'t match","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_f8;
        std::__cxx11::string::_M_construct<char*>(local_f0,local_1e0,local_1d8 + (long)local_1e0);
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
      }
      if (local_d8.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()(&DStack_d0,local_d8);
      }
      lVar12 = 0x20;
      do {
        ppVVar3 = *(VkDevice **)
                   ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object +
                   lVar12);
        if (ppVVar3 != (VkDevice *)0x0) {
          plVar2 = *(long **)((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                     deleter.m_deviceIface + lVar12);
          local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal =
               (deUint64)ppVVar3;
          (**(code **)(*plVar2 + 0x240))
                    (plVar2,*(undefined8 *)
                             ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                     deleter.m_device + lVar12),
                     *(undefined8 *)
                      ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                              m_pool.m_internal + lVar12),1);
        }
        *(undefined8 *)
         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device +
         lVar12) = 0;
        *(undefined8 *)
         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
                 m_internal + lVar12) = 0;
        *(undefined8 *)
         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + lVar12) = 0;
        *(undefined8 *)
         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
         + lVar12) = 0;
        lVar12 = lVar12 + -0x20;
      } while (lVar12 != -0x20);
      lVar12 = 0;
      do {
        obj.m_internal =
             *(deUint64 *)
              ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                      m_internal + lVar12);
        if (obj.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
                     ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                             deleter.m_deviceIface + lVar12),obj);
        }
        *(undefined8 *)
         ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device +
         lVar12) = 0;
        *(undefined8 *)
         ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                 m_allocator + lVar12) = 0;
        *(undefined8 *)
         ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
         + lVar12) = 0;
        *(undefined8 *)
         ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                 m_deviceIface + lVar12) = 0;
        lVar12 = lVar12 + -0x20;
      } while (lVar12 != -0x40);
      (**(code **)(*(long *)HVar5.m_internal + 8))(HVar5.m_internal);
      (**(code **)(*(long *)HVar4.m_internal + 8))(HVar4.m_internal);
      de::details::
      UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
      ::reset(&resource.
               super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
             );
      if (iVar9 != 0) goto LAB_007dc152;
      local_200 = local_200 + 1;
      pQVar11 = queuePairs.
                super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (local_200 <
             (uint)((int)((ulong)((long)queuePairs.
                                        super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)queuePairs.
                                       super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x55555555));
  }
  ppVVar3 = &local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal =
       (deUint64)ppVVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"OK","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,
             local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal,
             (undefined1 *)
             ((long)&(local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                     m_deviceIface)->_vptr_DeviceInterface +
             local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal));
  queuePairs.
  super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  ._M_impl.super__Vector_impl_data._M_start = pQVar11;
  if ((VkDevice *)local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal
      != ppVVar3) {
    operator_delete((void *)local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.
                            m_internal,
                    (ulong)(local_188.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                            m_device + 1));
  }
LAB_007dc152:
  if (queuePairs.
      super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(queuePairs.
                    super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)queuePairs.
                          super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)queuePairs.
                          super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate (void)
	{
		enum {WRITE=0, READ, COUNT};
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					device				= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		const Unique<VkSemaphore>		semaphore			(createSemaphore (vk, device));
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
		VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[WRITE], *ptrCmdBuffer[READ]};
		const VkPipelineStageFlags		stageBits[]			= { VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT };
		const VkSubmitInfo				submitInfo[2]		=
															{
																{
																	VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType			sType;
																	DE_NULL,							// const void*				pNext;
																	0u,									// deUint32					waitSemaphoreCount;
																	DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
																	(const VkPipelineStageFlags*)DE_NULL,
																	1u,									// deUint32					commandBufferCount;
																	&cmdBuffers[WRITE],					// const VkCommandBuffer*	pCommandBuffers;
																	1u,									// deUint32					signalSemaphoreCount;
																	&semaphore.get(),					// const VkSemaphore*		pSignalSemaphores;
																},
																{
																	VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType				sType;
																	DE_NULL,							// const void*					pNext;
																	1u,									// deUint32						waitSemaphoreCount;
																	&semaphore.get(),					// const VkSemaphore*			pWaitSemaphores;
																	stageBits,							// const VkPipelineStageFlags*	pWaitDstStageMask;
																	1u,									// deUint32						commandBufferCount;
																	&cmdBuffers[READ],					// const VkCommandBuffer*		pCommandBuffers;
																	0u,									// deUint32						signalSemaphoreCount;
																	DE_NULL,							// const VkSemaphore*			pSignalSemaphores;
																}
															};
		const SyncInfo					writeSync			= m_writeOp->getSyncInfo();
		const SyncInfo					readSync			= m_readOp->getSyncInfo();

		beginCommandBuffer(vk, cmdBuffers[WRITE]);

		m_writeOp->recordCommands(cmdBuffers[WRITE]);

		if (m_resource->getType() == RESOURCE_TYPE_IMAGE)
		{
			const VkImageMemoryBarrier barrier =  makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				writeSync.imageLayout, readSync.imageLayout, m_resource->getImage().handle, m_resource->getImage().subresourceRange);
			vk.cmdPipelineBarrier(cmdBuffers[WRITE],  writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
		}

		endCommandBuffer(vk, cmdBuffers[WRITE]);

		beginCommandBuffer(vk, cmdBuffers[READ]);

		m_readOp->recordCommands(cmdBuffers[READ]);

		endCommandBuffer(vk, cmdBuffers[READ]);

		VK_CHECK(vk.queueSubmit(queue, 2u, submitInfo, DE_NULL));
		VK_CHECK(vk.queueWaitIdle(queue));

		{
			const Data	expected = m_writeOp->getData();
			const Data	actual	 = m_readOp->getData();

			if (0 != deMemCmp(expected.data, actual.data, expected.size))
				return tcu::TestStatus::fail("Memory contents don't match");
		}

		return tcu::TestStatus::pass("OK");
	}